

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O2

void FastPForLib::__pack<9u,true>(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t k;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = 0;
  for (iVar3 = 0; iVar3 != 9; iVar3 = iVar3 + 1) {
    if (iVar5 == 0) {
      uVar4 = *in;
      in = in + 1;
      *out = uVar4 & 0x1ff;
      iVar5 = 9;
    }
    for (uVar4 = iVar5 - 0x20; uVar4 + 0x20 < 0x18; uVar4 = uVar4 + 9) {
      uVar1 = *in;
      in = in + 1;
      *out = *out | (uVar1 & 0x1ff) << (uVar4 + 0x20 & 0x1f);
    }
    iVar5 = 0;
    if (0xffffffdf < uVar4) {
      uVar1 = *in;
      uVar2 = *in;
      in = in + 1;
      *out = *out | (uVar1 & 0x1ff) << (uVar4 + 0x20 & 0x1f);
      iVar5 = uVar4 + 9;
      out[1] = (uVar2 & 0x1ff) >> ((byte)-(char)uVar4 & 0x1f);
    }
    out = out + 1;
  }
  return;
}

Assistant:

void __pack(const uint32_t *__restrict__ in, uint32_t *__restrict__ out) {
  uint32_t inwordpointer = 0; // indicates where we are reading
  // k iterates over the output
  for (uint32_t k = 0; k < bit; ++k, ++out) {
    if (inwordpointer == 0) {
      *out = __bitmask<bit, mask>(*in++);
      inwordpointer += bit;
    }
    // compiler (gcc 4.6.3) had trouble with this, cannot unroll
    // while(inwordpointer <= 32-bit) {
    //    *out |= __bitmask<bit, mask> (*in++) << inwordpointer;
    //    inwordpointer += bit;
    //}
    // attempt (grungy!)

    // loop cannot iterate much
    for (uint32_t i = 0; i < 1 + 32 / bit; ++i) {
      if (inwordpointer > 32 - bit)
        break;
      *out |= __bitmask<bit, mask>(*in++) << inwordpointer;
      inwordpointer += bit;
    }
    // end ofk grunge

    if (inwordpointer < 32) {
      *out |= __bitmask<bit, mask>(*in) << inwordpointer;
      inwordpointer += bit - 32;
      *(out + 1) = __bitmask<bit, mask>(*in++) >> (bit - inwordpointer);

    } else
      // inwordpointer==32
      inwordpointer = 0;
  }
}